

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_patchclose(FuncState *fs,int list,int level)

{
  int local_14;
  int level_local;
  int list_local;
  FuncState *fs_local;
  
  for (local_14 = list; local_14 != -1; local_14 = getjump(fs,local_14)) {
    fs->f->code[local_14] = fs->f->code[local_14] & 0xffffc03f | (level + 1U & 0xff) << 6;
  }
  return;
}

Assistant:

void luaK_patchclose(FuncState *fs, int list, int level) {
    level++;  /* argument is +1 to reserve 0 as non-op */
    for (; list != NO_JUMP; list = getjump(fs, list)) {
        lua_assert(GET_OPCODE(fs->f->code[list]) == OP_JMP &&
                   (GETARG_A(fs->f->code[list]) == 0 ||
                    GETARG_A(fs->f->code[list]) >= level));
        SETARG_A(fs->f->code[list], level);
    }
}